

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BotSharedData.cpp
# Opt level: O3

void __thiscall tiger::trains::ai::BotSharedData::BotSharedData(BotSharedData *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->inPoints)._M_t._M_impl.super__Rb_tree_header;
  (this->inPoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->inPoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->inPoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->inPoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->inPoints)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->blockLines)._M_t._M_impl.super__Rb_tree_header;
  (this->blockLines)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->blockLines)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->blockLines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->blockLines)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->blockLines)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->barrierMap)._M_t._M_impl.super__Rb_tree_header;
  (this->barrierMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->barrierMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->barrierMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->barrierMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->barrierMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->trainInPoints)._M_t._M_impl.super__Rb_tree_header;
  (this->trainInPoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->trainInPoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->trainInPoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->trainInPoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->trainInPoints)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  HomeChecker::HomeChecker(&this->cheker);
  return;
}

Assistant:

BotSharedData::BotSharedData()
{

}